

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

CURLcode Curl_ssl_push_certinfo_len
                   (Curl_easy *data,int certnum,char *label,char *value,size_t valuelen)

{
  CURLcode CVar1;
  char *data_00;
  curl_slist *pcVar2;
  undefined1 local_70 [8];
  dynbuf build;
  CURLcode result;
  curl_slist *nl;
  curl_certinfo *ci;
  size_t valuelen_local;
  char *value_local;
  char *label_local;
  int certnum_local;
  Curl_easy *data_local;
  
  build.toobig._4_4_ = CURLE_OK;
  Curl_dyn_init((dynbuf *)local_70,100000);
  CVar1 = Curl_dyn_add((dynbuf *)local_70,label);
  if (((CVar1 == CURLE_OK) && (CVar1 = Curl_dyn_addn((dynbuf *)local_70,":",1), CVar1 == CURLE_OK))
     && (CVar1 = Curl_dyn_addn((dynbuf *)local_70,value,valuelen), CVar1 == CURLE_OK)) {
    pcVar2 = (data->info).certs.certinfo[certnum];
    data_00 = Curl_dyn_ptr((dynbuf *)local_70);
    pcVar2 = Curl_slist_append_nodup(pcVar2,data_00);
    if (pcVar2 == (curl_slist *)0x0) {
      Curl_dyn_free((dynbuf *)local_70);
      curl_slist_free_all((data->info).certs.certinfo[certnum]);
      build.toobig._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    (data->info).certs.certinfo[certnum] = pcVar2;
    return build.toobig._4_4_;
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_ssl_push_certinfo_len(struct Curl_easy *data,
                                    int certnum,
                                    const char *label,
                                    const char *value,
                                    size_t valuelen)
{
  struct curl_certinfo *ci = &data->info.certs;
  struct curl_slist *nl;
  CURLcode result = CURLE_OK;
  struct dynbuf build;

  DEBUGASSERT(certnum < ci->num_of_certs);

  Curl_dyn_init(&build, CURL_X509_STR_MAX);

  if(Curl_dyn_add(&build, label) ||
     Curl_dyn_addn(&build, ":", 1) ||
     Curl_dyn_addn(&build, value, valuelen))
    return CURLE_OUT_OF_MEMORY;

  nl = Curl_slist_append_nodup(ci->certinfo[certnum],
                               Curl_dyn_ptr(&build));
  if(!nl) {
    Curl_dyn_free(&build);
    curl_slist_free_all(ci->certinfo[certnum]);
    result = CURLE_OUT_OF_MEMORY;
  }

  ci->certinfo[certnum] = nl;
  return result;
}